

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.h
# Opt level: O0

void __thiscall
irr::CIrrDeviceSDL::CCursorControl::setRelativeMode(CCursorControl *this,bool relative)

{
  uint uVar1;
  byte in_SIL;
  
  uVar1 = SDL_GetRelativeMouseMode();
  if ((in_SIL & 1) != uVar1) {
    if ((in_SIL & 1) == 0) {
      SDL_SetRelativeMouseMode(0);
    }
    else {
      SDL_SetRelativeMouseMode(1);
    }
  }
  return;
}

Assistant:

virtual void setRelativeMode(bool relative) _IRR_OVERRIDE_
		{
			// Only change it when necessary, as it flushes mouse motion when enabled
			if (relative != SDL_GetRelativeMouseMode()) {
				if (relative)
					SDL_SetRelativeMouseMode(SDL_TRUE);
				else
					SDL_SetRelativeMouseMode(SDL_FALSE);
			}
		}